

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int getFileMode(char *zFile,mode_t *pMode,uid_t *pUid,gid_t *pGid)

{
  int iVar1;
  int iVar2;
  stat sStat;
  undefined1 auStack_a8 [24];
  uint local_90;
  uid_t local_8c;
  gid_t local_88;
  
  iVar1 = (*aSyscall[4].pCurrent)(zFile,auStack_a8);
  iVar2 = 0x70a;
  if (iVar1 == 0) {
    *pMode = local_90 & 0x1ff;
    *pUid = local_8c;
    *pGid = local_88;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int getFileMode(
  const char *zFile,              /* File name */
  mode_t *pMode,                  /* OUT: Permissions of zFile */
  uid_t *pUid,                    /* OUT: uid of zFile. */
  gid_t *pGid                     /* OUT: gid of zFile. */
){
  struct stat sStat;              /* Output of stat() on database file */
  int rc = SQLITE_OK;
  if( 0==osStat(zFile, &sStat) ){
    *pMode = sStat.st_mode & 0777;
    *pUid = sStat.st_uid;
    *pGid = sStat.st_gid;
  }else{
    rc = SQLITE_IOERR_FSTAT;
  }
  return rc;
}